

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkRwtSetSS(ARKodeMem ark_mem,N_Vector My,N_Vector weight)

{
  N_Vector in_RDX;
  long in_RDI;
  realtype rVar1;
  N_Vector in_stack_ffffffffffffffd8;
  int local_4;
  
  N_VAbs(in_RDX,in_stack_ffffffffffffffd8);
  N_VScale((realtype)in_RDX,in_stack_ffffffffffffffd8,(N_Vector)0x1161870);
  N_VAddConst(in_RDX,(realtype)in_stack_ffffffffffffffd8,(N_Vector)0x1161897);
  if ((*(int *)(in_RDI + 0x50) == 0) || (rVar1 = N_VMin(in_RDX), 0.0 < rVar1)) {
    N_VInv(in_RDX,in_stack_ffffffffffffffd8);
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int arkRwtSetSS(ARKodeMem ark_mem, N_Vector My, N_Vector weight)
{
  N_VAbs(My, ark_mem->tempv1);
  N_VScale(ark_mem->reltol, ark_mem->tempv1, ark_mem->tempv1);
  N_VAddConst(ark_mem->tempv1, ark_mem->SRabstol, ark_mem->tempv1);
  if (ark_mem->Ratolmin0) {
    if (N_VMin(ark_mem->tempv1) <= ZERO) return(-1);
  }
  N_VInv(ark_mem->tempv1, weight);
  return(0);
}